

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_server_transporter.cpp
# Opt level: O3

void __thiscall
PipelineServerTransporter::OnPipeConnection
          (PipelineServerTransporter *this,uv_stream_t *pipe,int status)

{
  int iVar1;
  uv_pipe_t *puVar2;
  
  if (status < 0) {
    (*(this->super_Transporter)._vptr_Transporter[2])(this);
    return;
  }
  puVar2 = (uv_pipe_t *)malloc(0x108);
  this->uvClient = puVar2;
  uv_pipe_init((this->super_Transporter).loop,puVar2,0);
  puVar2 = this->uvClient;
  puVar2->data = this;
  iVar1 = uv_accept((uv_stream_t *)&this->uvServer,(uv_stream_t *)puVar2);
  if (iVar1 == 0) {
    (*(this->super_Transporter)._vptr_Transporter[5])(this,1);
    uv_read_start((uv_stream_t *)this->uvClient,echo_alloc,after_read);
    return;
  }
  __assert_fail("r == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/transporter/pipeline_server_transporter.cpp"
                ,0x6c,"void PipelineServerTransporter::OnPipeConnection(uv_stream_t *, int)");
}

Assistant:

void PipelineServerTransporter::OnPipeConnection(uv_stream_t* pipe, int status) {
	if (status < 0) {
		Stop();
	}
	else {
        // todo: close prev uvClient
		uvClient = (uv_pipe_t*)malloc(sizeof(uv_pipe_t));
		uv_pipe_init(loop, uvClient, 0);
		uvClient->data = this;
		const int r = uv_accept((uv_stream_t*)&uvServer, (uv_stream_t*)uvClient);
		assert(r == 0);
		OnConnect(true);
		uv_read_start((uv_stream_t*)uvClient, echo_alloc, after_read);
	}
}